

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

ssize_t __thiscall r_code::SysView::read(SysView *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  undefined4 in_register_00000034;
  uint *puVar4;
  ulong uVar5;
  Atom local_3c;
  ulong local_38;
  
  puVar4 = (uint *)CONCAT44(in_register_00000034,__fd);
  uVar1 = *puVar4;
  uVar3 = (ulong)puVar4[1];
  local_38 = uVar3;
  for (uVar5 = 0; uVar2 = local_38, uVar1 != uVar5; uVar5 = uVar5 + 1) {
    Atom::Atom(&local_3c,puVar4[uVar5 + 2]);
    std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::push_back
              (&(this->super_ImageObject).code.m_vector,&local_3c);
    Atom::~Atom(&local_3c);
    uVar3 = extraout_RAX;
  }
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    vector<unsigned_int>::push_back
              (&(this->super_ImageObject).references,puVar4[(ulong)uVar1 + uVar5 + 2]);
    uVar3 = extraout_RAX_00;
  }
  return uVar3;
}

Assistant:

void SysView::read(uint32_t *data)
{
    size_t code_size = data[0];
    size_t reference_set_size = data[1];
    size_t i;
    size_t j;

    for (i = 0; i < code_size; ++i) {
        code.push_back(Atom(data[2 + i]));
    }

    for (j = 0; j < reference_set_size; ++j) {
        references.push_back(data[2 + i + j]);
    }
}